

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUpdateLeft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *eps,
                 number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *vec,int *nonz,int n)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  cpp_dec_float<100U,_int,_void> *pcVar13;
  cpp_dec_float<100U,_int,_void> *pcVar14;
  cpp_dec_float<100U,_int,_void> *pcVar15;
  type_conflict5 tVar16;
  bool bVar17;
  long lVar18;
  cpp_dec_float<100U,_int,_void> *pcVar19;
  int iVar20;
  int *piVar21;
  int local_220;
  int local_21c;
  cpp_dec_float<100U,_int,_void> local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c0;
  cpp_dec_float<100U,_int,_void> local_1b8;
  int *local_168;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_160;
  int *local_158;
  int *local_150;
  int *local_148;
  pointer local_140;
  long local_138;
  long local_130;
  cpp_dec_float<100U,_int,_void> local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  local_140 = (this->l).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_148 = (this->l).idx;
  local_150 = (this->l).row;
  local_158 = (this->l).start;
  local_138 = (long)(this->l).firstUpdate;
  local_130 = (long)(this->l).firstUnused;
  local_220 = n;
  local_168 = nonz;
  local_160 = eps;
  while (local_138 < local_130) {
    lVar18 = local_130 + -1;
    iVar2 = local_150[lVar18];
    uVar6 = *(undefined8 *)vec[iVar2].m_backend.data._M_elems;
    uVar7 = *(undefined8 *)(vec[iVar2].m_backend.data._M_elems + 2);
    puVar1 = vec[iVar2].m_backend.data._M_elems + 4;
    uVar8 = *(undefined8 *)puVar1;
    uVar9 = *(undefined8 *)(puVar1 + 2);
    puVar1 = vec[iVar2].m_backend.data._M_elems + 8;
    uVar10 = *(undefined8 *)puVar1;
    uVar11 = *(undefined8 *)(puVar1 + 2);
    puVar1 = vec[iVar2].m_backend.data._M_elems + 0xc;
    uVar12 = *(undefined8 *)puVar1;
    local_218.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
    local_218.data._M_elems[0xc] = (uint)uVar12;
    local_218.data._M_elems[0xd] = (uint)((ulong)uVar12 >> 0x20);
    local_218.data._M_elems[8] = (uint)uVar10;
    local_218.data._M_elems[9] = (uint)((ulong)uVar10 >> 0x20);
    local_218.data._M_elems[10] = (uint)uVar11;
    local_218.data._M_elems[0xb] = (uint)((ulong)uVar11 >> 0x20);
    local_218.data._M_elems[4] = (uint)uVar8;
    local_218.data._M_elems[5] = (uint)((ulong)uVar8 >> 0x20);
    local_218.data._M_elems[6] = (uint)uVar9;
    local_218.data._M_elems[7] = (uint)((ulong)uVar9 >> 0x20);
    local_218.data._M_elems[0] = (uint)uVar6;
    local_218.data._M_elems[1] = (uint)((ulong)uVar6 >> 0x20);
    local_218.data._M_elems[2] = (uint)uVar7;
    local_218.data._M_elems[3] = (uint)((ulong)uVar7 >> 0x20);
    local_218.exp = vec[iVar2].m_backend.exp;
    local_218.neg = vec[iVar2].m_backend.neg;
    local_218.fpclass = vec[iVar2].m_backend.fpclass;
    local_218.prec_elem = vec[iVar2].m_backend.prec_elem;
    puVar1 = vec[iVar2].m_backend.data._M_elems + 1;
    local_128.data._M_elems._4_8_ = *(undefined8 *)puVar1;
    local_128.data._M_elems._12_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = vec[iVar2].m_backend.data._M_elems + 5;
    local_128.data._M_elems._20_8_ = *(undefined8 *)puVar1;
    local_128.data._M_elems._28_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = vec[iVar2].m_backend.data._M_elems + 9;
    local_128.data._M_elems._36_8_ = *(undefined8 *)puVar1;
    uVar6 = *(undefined8 *)(puVar1 + 2);
    puVar1 = vec[iVar2].m_backend.data._M_elems + 0xc;
    local_128.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
    local_128.data._M_elems[0xd] = (uint)((ulong)*(undefined8 *)puVar1 >> 0x20);
    local_128.data._M_elems[0xb] = (uint)uVar6;
    local_128.data._M_elems[0xc] = (uint)((ulong)uVar6 >> 0x20);
    local_128.data._M_elems[0] = local_218.data._M_elems[0];
    local_128.neg =
         (bool)((local_218.data._M_elems[0] != 0 || local_218.fpclass != cpp_dec_float_finite) ^
               local_218.neg);
    piVar21 = local_148 + local_158[lVar18];
    local_1c0 = vec + iVar2;
    iVar20 = local_158[local_130];
    pcVar19 = &local_140[local_158[lVar18]].m_backend;
    local_130 = lVar18;
    local_128.exp = local_218.exp;
    local_128.fpclass = local_218.fpclass;
    local_128.prec_elem = local_218.prec_elem;
    for (; iVar2 < iVar20; iVar20 = iVar20 + -1) {
      iVar3 = *piVar21;
      piVar21 = piVar21 + 1;
      local_1b8.fpclass = cpp_dec_float_finite;
      local_1b8.prec_elem = 0x10;
      local_1b8.data._M_elems[0] = 0;
      local_1b8.data._M_elems[1] = 0;
      local_1b8.data._M_elems[2] = 0;
      local_1b8.data._M_elems[3] = 0;
      local_1b8.data._M_elems[4] = 0;
      local_1b8.data._M_elems[5] = 0;
      local_1b8.data._M_elems[6] = 0;
      local_1b8.data._M_elems[7] = 0;
      local_1b8.data._M_elems[8] = 0;
      local_1b8.data._M_elems[9] = 0;
      local_1b8.data._M_elems[10] = 0;
      local_1b8.data._M_elems[0xb] = 0;
      local_1b8.data._M_elems[0xc] = 0;
      local_1b8.data._M_elems[0xd] = 0;
      local_1b8.data._M_elems._56_5_ = 0;
      local_1b8.data._M_elems[0xf]._1_3_ = 0;
      local_1b8.exp = 0;
      local_1b8.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_1b8,&vec[iVar3].m_backend,pcVar19);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                (&local_128,&local_1b8);
      pcVar19 = pcVar19 + 1;
    }
    local_1b8.data._M_elems._0_8_ = local_1b8.data._M_elems._0_8_ & 0xffffffff00000000;
    tVar16 = boost::multiprecision::operator==
                       ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_218,(int *)&local_1b8);
    local_218.data._M_elems[0xd] = local_128.data._M_elems[0xd];
    local_218.data._M_elems[0xe] = local_128.data._M_elems[0xe];
    local_218.data._M_elems[0xf] = local_128.data._M_elems[0xf];
    local_218.data._M_elems[9] = local_128.data._M_elems[9];
    local_218.data._M_elems[10] = local_128.data._M_elems[10];
    local_218.data._M_elems[0xb] = local_128.data._M_elems[0xb];
    local_218.data._M_elems[0xc] = local_128.data._M_elems[0xc];
    local_218.data._M_elems[5] = local_128.data._M_elems[5];
    local_218.data._M_elems[6] = local_128.data._M_elems[6];
    local_218.data._M_elems[7] = local_128.data._M_elems[7];
    local_218.data._M_elems[8] = local_128.data._M_elems[8];
    local_218.data._M_elems[1] = local_128.data._M_elems[1];
    local_218.data._M_elems[2] = local_128.data._M_elems[2];
    local_218.data._M_elems[3] = local_128.data._M_elems[3];
    local_218.data._M_elems[4] = local_128.data._M_elems[4];
    local_218.data._M_elems[0] = local_128.data._M_elems[0];
    local_218.neg =
         (bool)((local_128.data._M_elems[0] != 0 || local_128.fpclass != cpp_dec_float_finite) ^
               local_128.neg);
    local_218.exp = local_128.exp;
    local_218.fpclass = local_128.fpclass;
    local_218.prec_elem = local_128.prec_elem;
    if (tVar16) {
      local_d8.m_backend.data._M_elems[1] = local_128.data._M_elems[1];
      local_d8.m_backend.data._M_elems[2] = local_128.data._M_elems[2];
      local_d8.m_backend.data._M_elems[5] = local_218.data._M_elems[5];
      local_d8.m_backend.data._M_elems[4] = local_218.data._M_elems[4];
      local_d8.m_backend.data._M_elems[7] = local_218.data._M_elems[7];
      local_d8.m_backend.data._M_elems[6] = local_218.data._M_elems[6];
      local_d8.m_backend.data._M_elems[9] = local_218.data._M_elems[9];
      local_d8.m_backend.data._M_elems[8] = local_218.data._M_elems[8];
      local_d8.m_backend.data._M_elems[0xb] = local_128.data._M_elems[0xb];
      local_d8.m_backend.data._M_elems[10] = local_218.data._M_elems[10];
      local_d8.m_backend.data._M_elems[0xd] = local_128.data._M_elems[0xd];
      local_d8.m_backend.data._M_elems[0xc] = local_128.data._M_elems[0xc];
      local_d8.m_backend.data._M_elems[0xe] = local_128.data._M_elems[0xe];
      local_d8.m_backend.data._M_elems[0xf] = local_128.data._M_elems[0xf];
      local_d8.m_backend.data._M_elems[0] = local_128.data._M_elems[0];
      local_d8.m_backend.data._M_elems[3] = local_218.data._M_elems[3];
      local_d8.m_backend.exp = local_128.exp;
      local_d8.m_backend.fpclass = local_128.fpclass;
      local_d8.m_backend.prec_elem = local_128.prec_elem;
      local_88.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_160->m_backend).data._M_elems;
      local_88.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((local_160->m_backend).data._M_elems + 2);
      local_88.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((local_160->m_backend).data._M_elems + 4);
      local_88.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((local_160->m_backend).data._M_elems + 6);
      local_88.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((local_160->m_backend).data._M_elems + 8);
      local_88.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((local_160->m_backend).data._M_elems + 10);
      local_88.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((local_160->m_backend).data._M_elems + 0xc);
      local_88.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((local_160->m_backend).data._M_elems + 0xe);
      local_88.m_backend.exp = (local_160->m_backend).exp;
      local_88.m_backend.neg = (local_160->m_backend).neg;
      local_88.m_backend.fpclass = (local_160->m_backend).fpclass;
      local_88.m_backend.prec_elem = (local_160->m_backend).prec_elem;
      local_d8.m_backend.neg = local_218.neg;
      bVar17 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (&local_d8,&local_88);
      if (bVar17) {
        lVar18 = (long)local_220;
        local_220 = local_220 + 1;
        local_168[lVar18] = iVar2;
        *(ulong *)((local_1c0->m_backend).data._M_elems + 0xc) =
             CONCAT44(local_218.data._M_elems[0xd],local_218.data._M_elems[0xc]);
        *(undefined8 *)((local_1c0->m_backend).data._M_elems + 0xe) = local_218.data._M_elems._56_8_
        ;
        *(ulong *)((local_1c0->m_backend).data._M_elems + 8) =
             CONCAT44(local_218.data._M_elems[9],local_218.data._M_elems[8]);
        *(ulong *)((local_1c0->m_backend).data._M_elems + 10) =
             CONCAT44(local_218.data._M_elems[0xb],local_218.data._M_elems[10]);
        *(ulong *)((local_1c0->m_backend).data._M_elems + 4) =
             CONCAT44(local_218.data._M_elems[5],local_218.data._M_elems[4]);
        *(ulong *)((local_1c0->m_backend).data._M_elems + 6) =
             CONCAT44(local_218.data._M_elems[7],local_218.data._M_elems[6]);
        *(ulong *)(local_1c0->m_backend).data._M_elems =
             CONCAT44(local_218.data._M_elems[1],local_218.data._M_elems[0]);
        *(ulong *)((local_1c0->m_backend).data._M_elems + 2) =
             CONCAT44(local_218.data._M_elems[3],local_218.data._M_elems[2]);
        (local_1c0->m_backend).exp = local_218.exp;
        (local_1c0->m_backend).neg = local_218.neg;
        (local_1c0->m_backend).fpclass = local_218.fpclass;
        (local_1c0->m_backend).prec_elem = local_218.prec_elem;
      }
    }
    else {
      local_21c = 0;
      tVar16 = boost::multiprecision::operator!=
                         ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_218,&local_21c);
      if (tVar16) {
        local_1b8.data._M_elems[0xc] = local_218.data._M_elems[0xc];
        local_1b8.data._M_elems[0xd] = local_218.data._M_elems[0xd];
        local_1b8.data._M_elems._56_5_ = local_218.data._M_elems._56_5_;
        local_1b8.data._M_elems[0xf]._1_3_ = local_218.data._M_elems[0xf]._1_3_;
        local_1b8.data._M_elems[8] = local_218.data._M_elems[8];
        local_1b8.data._M_elems[9] = local_218.data._M_elems[9];
        local_1b8.data._M_elems[10] = local_218.data._M_elems[10];
        local_1b8.data._M_elems[0xb] = local_218.data._M_elems[0xb];
        local_1b8.data._M_elems[4] = local_218.data._M_elems[4];
        local_1b8.data._M_elems[5] = local_218.data._M_elems[5];
        local_1b8.data._M_elems[6] = local_218.data._M_elems[6];
        local_1b8.data._M_elems[7] = local_218.data._M_elems[7];
        local_1b8.data._M_elems[0] = local_218.data._M_elems[0];
        local_1b8.data._M_elems[1] = local_218.data._M_elems[1];
        local_1b8.data._M_elems[2] = local_218.data._M_elems[2];
        local_1b8.data._M_elems[3] = local_218.data._M_elems[3];
        pcVar19 = &local_218;
        pcVar13 = &local_218;
        pcVar14 = &local_218;
        pcVar15 = &local_218;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  (&local_1b8,1e-100,(type *)0x0);
        pcVar19 = &local_1b8;
        pcVar13 = &local_1b8;
        pcVar14 = &local_1b8;
        pcVar15 = &local_1b8;
      }
      iVar2 = pcVar19->exp;
      bVar17 = pcVar13->neg;
      fVar4 = pcVar14->fpclass;
      iVar5 = pcVar15->prec_elem;
      *(undefined8 *)((local_1c0->m_backend).data._M_elems + 0xc) = local_1b8.data._M_elems._48_8_;
      *(ulong *)((local_1c0->m_backend).data._M_elems + 0xe) =
           CONCAT35(local_1b8.data._M_elems[0xf]._1_3_,local_1b8.data._M_elems._56_5_);
      *(undefined8 *)((local_1c0->m_backend).data._M_elems + 8) = local_1b8.data._M_elems._32_8_;
      *(undefined8 *)((local_1c0->m_backend).data._M_elems + 10) = local_1b8.data._M_elems._40_8_;
      *(undefined8 *)((local_1c0->m_backend).data._M_elems + 4) = local_1b8.data._M_elems._16_8_;
      *(undefined8 *)((local_1c0->m_backend).data._M_elems + 6) = local_1b8.data._M_elems._24_8_;
      *(undefined8 *)(local_1c0->m_backend).data._M_elems = local_1b8.data._M_elems._0_8_;
      *(undefined8 *)((local_1c0->m_backend).data._M_elems + 2) = local_1b8.data._M_elems._8_8_;
      (local_1c0->m_backend).exp = iVar2;
      (local_1c0->m_backend).neg = bVar17;
      (local_1c0->m_backend).fpclass = fVar4;
      (local_1c0->m_backend).prec_elem = iVar5;
    }
  }
  return local_220;
}

Assistant:

int CLUFactor<R>::solveUpdateLeft(R eps, R* vec, int* nonz, int n)
{
   int i, j, k, end;
   R y;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   assert(!l.updateType);               /* no Forest-Tomlin Updates! */

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      k = lbeg[i];
      assert(k >= 0 && k < l.size);
      val = &lval[k];
      idx = &lidx[k];

      k = lrow[i];

      y = vec[k];
      StableSum<R> tmp(-y);

      for(j = lbeg[i + 1]; j > k; --j)
      {
         assert(*idx >= 0 && *idx < thedim);
         tmp += vec[*idx++] * (*val++);
      }

      if(y == 0)
      {
         y = -R(tmp);

         if(isNotZero(y, eps))
         {
            nonz[n++] = k;
            vec[k] = y;
         }
      }
      else
      {
         y = -R(tmp);
         vec[k] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
      }
   }

   return n;
}